

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

void rb_insert_node(rb_node **rbt,rb_node *rbn,ly_bool *max_p)

{
  code *local_48;
  _func_int_lyd_node_ptr_lyd_node_ptr *rb_compare;
  rb_node *prStack_38;
  int comp;
  rb_node *parent;
  rb_node *tmp;
  ly_bool max;
  ly_bool *max_p_local;
  rb_node *rbn_local;
  rb_node **rbt_local;
  
  prStack_38 = (rb_node *)0x0;
  rb_compare._4_4_ = 0;
  if ((*rbt)->dnode->schema->nodetype == 8) {
    local_48 = rb_compare_leaflists;
  }
  else {
    local_48 = rb_compare_lists;
  }
  tmp._7_1_ = '\x01';
  parent = *rbt;
  while (parent != (rb_node *)0x0) {
    prStack_38 = parent;
    rb_compare._4_4_ = (*local_48)(parent->dnode,rbn->dnode);
    if (rb_compare._4_4_ < 1) {
      parent = parent->right;
    }
    else {
      parent = parent->left;
      tmp._7_1_ = '\0';
    }
  }
  rb_set(rbn,prStack_38);
  if (prStack_38 == (rb_node *)0x0) {
    *rbt = rbn;
  }
  else if (rb_compare._4_4_ < 1) {
    prStack_38->right = rbn;
  }
  else {
    prStack_38->left = rbn;
  }
  rb_insert_color(rbt,rbn);
  if (max_p != (ly_bool *)0x0) {
    *max_p = tmp._7_1_;
  }
  return;
}

Assistant:

static void
rb_insert_node(struct rb_node **rbt, struct rb_node *rbn, ly_bool *max_p)
{
    ly_bool max;
    struct rb_node *tmp;
    struct rb_node *parent = NULL;
    int comp = 0;

    int (*rb_compare)(const struct lyd_node *n1, const struct lyd_node *n2);

    if (RBN_DNODE(*rbt)->schema->nodetype == LYS_LEAFLIST) {
        rb_compare = rb_compare_leaflists;
    } else {
        rb_compare = rb_compare_lists;
    }

    max = 1;
    tmp = *rbt;
    while (tmp != NULL) {
        parent = tmp;

        comp = rb_compare(RBN_DNODE(tmp), RBN_DNODE(rbn));
        if (comp > 0) {
            tmp = RBN_LEFT(tmp);
            max = 0;
        } else {
            tmp = RBN_RIGHT(tmp);
        }
    }

    rb_set(rbn, parent);

    if (parent != NULL) {
        if (comp > 0) {
            RBN_LEFT(parent) = rbn;
        } else {
            RBN_RIGHT(parent) = rbn;
        }
    } else {
        *rbt = rbn;
    }

    rb_insert_color(rbt, rbn);

    if (max_p) {
        *max_p = max;
    }
}